

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,Res res)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  uint faceid_00;
  uint8_t *puVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  PtexFaceData *pPVar8;
  Level *pLVar9;
  FaceData *pFVar10;
  ostream *poVar11;
  FaceData *pFVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pFVar13;
  ulong uVar14;
  undefined6 in_register_00000012;
  ulong uVar15;
  char *pcVar16;
  int levelid;
  uint levelid_00;
  char cVar17;
  uint uVar18;
  uint uVar19;
  size_t tableNewMemUsed;
  uint local_44;
  size_t newMemUsed;
  ReductionKey key;
  
  uVar15 = CONCAT62(in_register_00000012,res);
  if (((faceid < 0) || (this->_ok == false)) ||
     (uVar5 = (ulong)(uint)faceid, (this->_header).nfaces <= (uint)faceid)) {
    pFVar10 = errorData(this,true);
    return &pFVar10->super_PtexFaceData;
  }
  pFVar13 = (this->_faceinfo).
            super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar1 = pFVar13[uVar5].flags;
  if ((bVar1 & 1) != 0) {
LAB_00110b09:
    pPVar8 = (PtexFaceData *)operator_new(0x18);
    iVar7 = this->_pixelsize;
    puVar4 = this->_constdata;
    pPVar8->_vptr_PtexFaceData = (_func_int **)&PTR__PtexFaceData_0011fd30;
    pPVar8[1]._vptr_PtexFaceData = (_func_int **)(puVar4 + faceid * iVar7);
    *(int *)&pPVar8[2]._vptr_PtexFaceData = iVar7;
    return pPVar8;
  }
  uVar14 = uVar15 & 0xffffffff;
  cVar17 = (char)uVar14;
  if ((ushort)uVar14 < 0x100 && cVar17 == '\0') goto LAB_00110b09;
  uVar18 = (uint)uVar15;
  cVar6 = (char)(uVar14 >> 8);
  pFVar13 = pFVar13 + uVar5;
  cVar2 = (pFVar13->res).ulog2;
  cVar3 = (pFVar13->res).vlog2;
  if (cVar3 == cVar6 && cVar2 == cVar17) {
    pLVar9 = getLevel(this,0);
    pFVar10 = getFace(this,0,pLVar9,faceid,res);
    return &pFVar10->super_PtexFaceData;
  }
  levelid_00 = (int)cVar2 - (int)cVar17;
  uVar19 = (int)cVar3 - (int)cVar6;
  if ((((bVar1 & 2) == 0) && (levelid_00 == uVar19)) &&
     ((ulong)(long)(int)levelid_00 <
      (ulong)((long)(this->_levels).
                    super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_levels).
                    super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3))) {
    pLVar9 = getLevel(this,levelid_00);
    faceid_00 = (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5];
    if (((ulong)(long)(int)faceid_00 <
         (ulong)((long)(pLVar9->faces).
                       super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pLVar9->faces).
                       super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3)) &&
       (pFVar10 = getFace(this,levelid_00,pLVar9,faceid_00,res), pFVar10 != (FaceData *)0x0)) {
      return &pFVar10->super_PtexFaceData;
    }
  }
  local_44 = uVar19;
  ReductionKey::ReductionKey(&key,faceid,res);
  pFVar10 = PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
            get(&this->_reductions,&key);
  if (pFVar10 != (FaceData *)0x0) {
    return &pFVar10->super_PtexFaceData;
  }
  newMemUsed = 0;
  if (((ushort)res & 0x8080) == 0) {
    if (-1 < (int)(levelid_00 | local_44)) {
      uVar19 = uVar18 & 0x7f00;
      if ((this->_header).meshtype == 0) {
        if (levelid_00 != local_44) {
          pcVar16 = "PtexReader::getData - anisotropic reductions not supported for triangle mesh";
          goto LAB_00110c91;
        }
        iVar7 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                          (this,uVar5,(ulong)(uVar19 + (uVar18 + 1 & 0xff) + 0x100));
        tableNewMemUsed = CONCAT44(extraout_var_01,iVar7);
        pFVar10 = (FaceData *)
                  (**(code **)(*(long *)tableNewMemUsed + 0x50))
                            (tableNewMemUsed,this,uVar15 & 0xffffffff,PtexUtils::reduceTri,
                             &newMemUsed);
      }
      else {
        uVar14 = (ulong)(local_44 < levelid_00);
        if (levelid_00 == local_44) {
          uVar14 = uVar15 & 0xffffffff;
        }
        if ((uVar14 & 1) == 0) {
          iVar7 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                            (this,uVar5,(ulong)(uVar19 + (uVar18 & 0x7f) + 0x100));
          tableNewMemUsed = CONCAT44(extraout_var_00,iVar7);
          pFVar10 = (FaceData *)
                    (**(code **)(*(long *)tableNewMemUsed + 0x50))
                              (tableNewMemUsed,this,uVar15 & 0xffffffff,PtexUtils::reducev,
                               &newMemUsed);
        }
        else {
          iVar7 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                            (this,uVar5,(ulong)(uVar19 | uVar18 + 1 & 0xff));
          tableNewMemUsed = CONCAT44(extraout_var,iVar7);
          pFVar10 = (FaceData *)
                    (**(code **)(*(long *)tableNewMemUsed + 0x50))
                              (tableNewMemUsed,this,uVar15 & 0xffffffff,PtexUtils::reduceu,
                               &newMemUsed);
        }
      }
      PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr
                ((PtexPtr<Ptex::v2_2::PtexFaceData> *)&tableNewMemUsed);
      goto LAB_00110cab;
    }
    pcVar16 = "PtexReader::getData - enlargements not supported";
  }
  else {
    pcVar16 = "PtexReader::getData - reductions below 1 pixel not supported";
  }
LAB_00110c91:
  poVar11 = std::operator<<((ostream *)&std::cerr,pcVar16);
  std::endl<char,std::char_traits<char>>(poVar11);
  pFVar10 = errorData(this,false);
LAB_00110cab:
  tableNewMemUsed = 0;
  pFVar12 = PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
            tryInsert(&this->_reductions,&key,pFVar10,&tableNewMemUsed);
  if (pFVar12 == pFVar10) {
    if (tableNewMemUsed + newMemUsed == 0) {
      return &pFVar12->super_PtexFaceData;
    }
    LOCK();
    this->_memUsed = this->_memUsed + tableNewMemUsed + newMemUsed;
    UNLOCK();
    return &pFVar12->super_PtexFaceData;
  }
  if (pFVar10 == (FaceData *)0x0) {
    return &pFVar12->super_PtexFaceData;
  }
  (*(pFVar10->super_PtexFaceData)._vptr_PtexFaceData[1])(pFVar10);
  return &pFVar12->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // determine how many reduction levels are needed
    int redu = fi.res.ulog2 - res.ulog2, redv = fi.res.vlog2 - res.vlog2;

    if (redu == 0 && redv == 0) {
        // no reduction - get level zero (full) res face
        Level* level = getLevel(0);
        FaceData* face = getFace(0, level, faceid, res);
        return face;
    }

    if (redu == redv && !fi.hasEdits()) {
        // reduction is symmetric and non-negative
        // and face has no edits => access data from reduction level (if present)
        int levelid = redu;
        if (size_t(levelid) < _levels.size()) {
            Level* level = getLevel(levelid);

            // get reduction face id
            int rfaceid = _rfaceids[faceid];

            // get the face data (if present)
            FaceData* face = 0;
            if (size_t(rfaceid) < level->faces.size()) {
                face = getFace(levelid, level, rfaceid, res);
            }
            if (face) {
                return face;
            }
        }
    }

    // dynamic reduction required - look in dynamic reduction cache
    ReductionKey key(faceid, res);
    FaceData* face = _reductions.get(key);
    if (face) {
        return face;
    }

    // not found,  generate new reduction
    FaceData *newface = 0;
    size_t newMemUsed = 0;

    if (res.ulog2 < 0 || res.vlog2 < 0) {
        std::cerr << "PtexReader::getData - reductions below 1 pixel not supported" << std::endl;
        newface = errorData();
    }
    else if (redu < 0 || redv < 0) {
        std::cerr << "PtexReader::getData - enlargements not supported" << std::endl;
        newface = errorData();
    }
    else if (_header.meshtype == mt_triangle)
    {
        if (redu != redv) {
            std::cerr << "PtexReader::getData - anisotropic reductions not supported for triangle mesh" << std::endl;
            newface = errorData();
        }
        else {
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceTri, newMemUsed);
        }
    }
    else {
        // determine which direction to blend
        bool blendu;
        if (redu == redv) {
            // for symmetric face blends, alternate u and v blending
            blendu = (res.ulog2 & 1);
        }
        else blendu = redu > redv;

        if (blendu) {
            // get next-higher u-res and reduce in u
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)res.vlog2)) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceu, newMemUsed);
        }
        else {
            // get next-higher v-res and reduce in v
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)res.ulog2, (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reducev, newMemUsed);
        }
    }

    size_t tableNewMemUsed = 0;
    face = _reductions.tryInsert(key, newface, tableNewMemUsed);
    if (face != newface) {
        delete newface;
    }
    else {
        increaseMemUsed(newMemUsed + tableNewMemUsed);
    }
    return face;
}